

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSExportEntry *
add_export_entry2(JSContext *ctx,JSParseState *s,JSModuleDef *m,JSAtom local_name,JSAtom export_name
                 ,JSExportTypeEnum export_type)

{
  int iVar1;
  JSAtom JVar2;
  JSExportEntry *pJVar3;
  char *pcVar4;
  JSModuleDef *in_RDX;
  JSContext *in_RSI;
  JSContext *in_RDI;
  uint in_R8D;
  JSExportTypeEnum in_R9D;
  char buf1 [64];
  JSExportEntry *me;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78 [16];
  undefined1 auVar5 [12];
  JSContext *in_stack_ffffffffffffff88;
  JSExportEntry *local_8;
  
  auVar5 = in_stack_ffffffffffffff78._4_12_;
  pJVar3 = find_export_entry(in_RDI,in_RDX,in_R8D);
  if (pJVar3 == (JSExportEntry *)0x0) {
    iVar1 = js_resize_array(in_stack_ffffffffffffff88,auVar5._4_8_,auVar5._0_4_,
                            in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    if (iVar1 == 0) {
      iVar1 = in_RDX->export_entries_count;
      in_RDX->export_entries_count = iVar1 + 1;
      local_8 = in_RDX->export_entries + iVar1;
      memset(local_8,0,0x20);
      JVar2 = JS_DupAtom(auVar5._4_8_,auVar5._0_4_);
      local_8->local_name = JVar2;
      JVar2 = JS_DupAtom(auVar5._4_8_,auVar5._0_4_);
      local_8->export_name = JVar2;
      local_8->export_type = in_R9D;
    }
    else {
      local_8 = (JSExportEntry *)0x0;
    }
  }
  else {
    if (in_RSI == (JSContext *)0x0) {
      __JS_ThrowSyntaxErrorAtom(in_RDI,(JSAtom)(ulong)in_R8D,"duplicate exported name \'%s\'","");
    }
    else {
      pcVar4 = JS_AtomGetStr(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff6c,
                                                     in_stack_ffffffffffffff68),0,0x14313d);
      js_parse_error((JSParseState *)in_RSI,"duplicate exported name \'%s\'",pcVar4);
    }
    local_8 = (JSExportEntry *)0x0;
  }
  return local_8;
}

Assistant:

static JSExportEntry *add_export_entry2(JSContext *ctx,
                                        JSParseState *s, JSModuleDef *m,
                                       JSAtom local_name, JSAtom export_name,
                                       JSExportTypeEnum export_type)
{
    JSExportEntry *me;

    if (find_export_entry(ctx, m, export_name)) {
        char buf1[ATOM_GET_STR_BUF_SIZE];
        if (s) {
            js_parse_error(s, "duplicate exported name '%s'",
                           JS_AtomGetStr(ctx, buf1, sizeof(buf1), export_name));
        } else {
            JS_ThrowSyntaxErrorAtom(ctx, "duplicate exported name '%s'", export_name);
        }
        return NULL;
    }

    if (js_resize_array(ctx, (void **)&m->export_entries,
                        sizeof(JSExportEntry),
                        &m->export_entries_size,
                        m->export_entries_count + 1))
        return NULL;
    me = &m->export_entries[m->export_entries_count++];
    memset(me, 0, sizeof(*me));
    me->local_name = JS_DupAtom(ctx, local_name);
    me->export_name = JS_DupAtom(ctx, export_name);
    me->export_type = export_type;
    return me;
}